

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

bool __thiscall
args::ArgumentParser::
ParseLong<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ArgumentParser *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *it,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              end)

{
  undefined1 *puVar1;
  Options OVar2;
  int iVar3;
  undefined4 extraout_var;
  runtime_error *prVar4;
  ulong uVar5;
  string errorMessage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argchunk;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> joined;
  FlagBase *flag;
  
  uVar5 = 0xffffffffffffffff;
  std::__cxx11::string::substr((ulong)&argchunk,(ulong)it->_M_current);
  if ((this->longseparator)._M_string_length != 0) {
    uVar5 = std::__cxx11::string::find
                      ((char *)&argchunk,(ulong)(this->longseparator)._M_dataplus._M_p,0);
  }
  if (uVar5 == 0xffffffffffffffff) {
    arg._M_dataplus._M_p = (pointer)&arg.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&arg,argchunk._M_dataplus._M_p,
               argchunk._M_dataplus._M_p + argchunk._M_string_length);
    joined._M_dataplus._M_p = (pointer)&joined.field_2;
    joined._M_string_length = 0;
    joined.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)&arg,(string *)&argchunk,0,uVar5);
    std::__cxx11::string::substr((ulong)&joined,(ulong)&argchunk);
  }
  errorMessage._M_dataplus._M_p._0_2_ = 0;
  puVar1 = (undefined1 *)((long)&errorMessage.field_2 + 8);
  errorMessage._M_string_length = (size_type)puVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&errorMessage._M_string_length,arg._M_dataplus._M_p,
             arg._M_dataplus._M_p + arg._M_string_length);
  iVar3 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,&errorMessage);
  flag = (FlagBase *)CONCAT44(extraout_var,iVar3);
  if ((undefined1 *)errorMessage._M_string_length != puVar1) {
    operator_delete((void *)errorMessage._M_string_length);
  }
  if (flag != (FlagBase *)0x0) {
    values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ParseArgsValues<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&errorMessage,this,flag,&arg,it,end,this->allowSeparateLongValue,
               this->allowJoinedLongValue,uVar5 != 0xffffffffffffffff,&joined,false,&values);
    if (errorMessage._M_string_length == 0) {
      if (this->readCompletion == false) {
        (*(flag->super_NamedBase).super_Base._vptr_Base[0x14])(flag,&values);
      }
      OVar2 = (flag->super_NamedBase).super_Base.options;
      if ((OVar2 & KickOut) == None) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT62(errorMessage._M_dataplus._M_p._2_6_,errorMessage._M_dataplus._M_p._0_2_) !=
            &errorMessage.field_2) {
          operator_delete((undefined1 *)
                          CONCAT62(errorMessage._M_dataplus._M_p._2_6_,
                                   errorMessage._M_dataplus._M_p._0_2_));
        }
      }
      else {
        it->_M_current = it->_M_current + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT62(errorMessage._M_dataplus._M_p._2_6_,errorMessage._M_dataplus._M_p._0_2_) !=
            &errorMessage.field_2) {
          operator_delete((undefined1 *)
                          CONCAT62(errorMessage._M_dataplus._M_p._2_6_,
                                   errorMessage._M_dataplus._M_p._0_2_));
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&values);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)joined._M_dataplus._M_p != &joined.field_2) {
        operator_delete(joined._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)arg._M_dataplus._M_p != &arg.field_2) {
        operator_delete(arg._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)argchunk._M_dataplus._M_p != &argchunk.field_2) {
        operator_delete(argchunk._M_dataplus._M_p);
      }
      return (OVar2 & KickOut) == None;
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,(string *)&errorMessage);
    *(undefined ***)prVar4 = &PTR__runtime_error_0021e7a0;
    __cxa_throw(prVar4,&ParseError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator+(&errorMessage,"Flag could not be matched: ",&arg);
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,(string *)&errorMessage);
  *(undefined ***)prVar4 = &PTR__runtime_error_0021e7a0;
  __cxa_throw(prVar4,&ParseError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ParseLong(It &it, It end)
            {
                const auto &chunk = *it;
                const auto argchunk = chunk.substr(longprefix.size());
                // Try to separate it, in case of a separator:
                const auto separator = longseparator.empty() ? argchunk.npos : argchunk.find(longseparator);
                // If the separator is in the argument, separate it.
                const auto arg = (separator != argchunk.npos ?
                    std::string(argchunk, 0, separator)
                    : argchunk);
                const auto joined = (separator != argchunk.npos ?
                    argchunk.substr(separator + longseparator.size())
                    : std::string());

                if (auto flag = Match(arg))
                {
                    std::vector<std::string> values;
                    const std::string errorMessage = ParseArgsValues(*flag, arg, it, end, allowSeparateLongValue, allowJoinedLongValue,
                                                                     separator != argchunk.npos, joined, false, values);
                    if (!errorMessage.empty())
                    {
#ifndef ARGS_NOEXCEPT
                        throw ParseError(errorMessage);
#else
                        error = Error::Parse;
                        errorMsg = errorMessage;
                        return false;
#endif
                    }

                    if (!readCompletion)
                    {
                        flag->ParseValue(values);
                    }

                    if (flag->KickOut())
                    {
                        ++it;
                        return false;
                    }
                } else
                {
                    const std::string errorMessage("Flag could not be matched: " + arg);
#ifndef ARGS_NOEXCEPT
                    throw ParseError(errorMessage);
#else
                    error = Error::Parse;
                    errorMsg = errorMessage;
                    return false;
#endif
                }

                return true;
            }